

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8AllCertificatesNoPoliciesTest2Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section8AllCertificatesNoPoliciesTest2Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.8.2";
  local_88.should_validate = true;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006b87e0,(char *(*) [3])&PTR_anon_var_dwarf_3f4b94_006b8800,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8AllCertificatesNoPoliciesTest2Subpart1) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "NoPoliciesCACert",
                               "AllCertificatesNoPoliciesTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "NoPoliciesCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.2";
  info.should_validate = true;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}